

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFRAgent.cpp
# Opt level: O1

double * __thiscall Agent::CFRAgent<Kuhn::Game>::strategy(CFRAgent<Kuhn::Game> *this,Game *game)

{
  const_iterator cVar1;
  double *pdVar2;
  undefined8 uVar3;
  string local_30;
  
  Kuhn::Game::infoSetStr_abi_cxx11_(&local_30,game);
  cVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->mStrategy)._M_h,&local_30);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_true>
      ._M_cur != (__node_type *)0x0) {
    pdVar2 = Trainer::Node::averageStrategy
                       (*(Node **)((long)cVar1.
                                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_true>
                                         ._M_cur + 0x28));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    return pdVar2;
  }
  uVar3 = std::__throw_out_of_range("_Map_base::at");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(uVar3);
}

Assistant:

const double *CFRAgent<T>::strategy(const T &game) const {
    return mStrategy.at(game.infoSetStr())->averageStrategy();
}